

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O2

void __thiscall
duckdb::TestGeneratedValues::AddColumn
          (TestGeneratedValues *this,vector<duckdb::Value,_true> *values)

{
  reference pvVar1;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if ((this->column_values).
      super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
      .
      super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->column_values).
      super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
      .
      super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar1 = vector<duckdb::vector<duckdb::Value,_true>,_true>::get<true>(&this->column_values,0);
    if ((long)(pvVar1->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar1->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start !=
        (long)(values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Size mismatch when adding a column to TestGeneratedValues",
                 &local_39);
      InternalException::InternalException(this_00,&local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ::std::
  vector<duckdb::vector<duckdb::Value,true>,std::allocator<duckdb::vector<duckdb::Value,true>>>::
  emplace_back<duckdb::vector<duckdb::Value,true>>
            ((vector<duckdb::vector<duckdb::Value,true>,std::allocator<duckdb::vector<duckdb::Value,true>>>
              *)this,values);
  return;
}

Assistant:

void AddColumn(vector<Value> values) {
		if (!column_values.empty() && column_values[0].size() != values.size()) {
			throw InternalException("Size mismatch when adding a column to TestGeneratedValues");
		}
		column_values.push_back(std::move(values));
	}